

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O3

string * __thiscall
CNscContext::GetDefineValue_abi_cxx11_(CNscContext *this,DefineEntry *psDefine,bool fSimpleOnly)

{
  NscSymbolFence *pNVar1;
  char *pcVar2;
  char *pcVar3;
  NscMessage nMessage;
  string *psVar4;
  char szLineNumber [32];
  char acStack_48 [40];
  
  pcVar2 = acStack_48;
  switch(psDefine->nMacro) {
  case NscMacro_Simple:
    psVar4 = &psDefine->strValue;
    break;
  case NscMacro_FunctionLike:
    psVar4 = &psDefine->strValue;
    if (fSimpleOnly) {
      nMessage = NscMessage_ErrorFunctionLikeMacroNotAllowed;
    }
    else {
      nMessage = NscMessage_ErrorFunctionLikeMacroNotImpl;
    }
    GenerateMessage(this,nMessage);
    break;
  case NscMacro_File:
    psVar4 = &this->m_strDefineScratch;
    std::__cxx11::string::_M_replace
              ((ulong)psVar4,0,(char *)(this->m_strDefineScratch)._M_string_length,0x17d80f);
    std::__cxx11::string::_M_append
              ((char *)psVar4,
               (ulong)(this->m_asFiles).
                      super__Vector_base<CNscContext::File,_std::allocator<CNscContext::File>_>.
                      _M_impl.super__Vector_impl_data._M_start[this->m_pStreamTop->nFile].strName.
                      _M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar4);
    break;
  case NscMacro_Line:
    snprintf(acStack_48,0x20,"%d",(ulong)(uint)this->m_pStreamTop->nLine);
    goto LAB_0014481a;
  case NscMacro_Date:
    psVar4 = &this->m_strCompileDate;
    break;
  case NscMacro_Time:
    psVar4 = &this->m_strCompileTime;
    break;
  case NscMacro_NscCompilerDate:
    pcVar3 = (char *)(this->m_strDefineScratch)._M_string_length;
    pcVar2 = "\"Apr 25 2025\"";
    goto LAB_00144860;
  case NscMacro_NscCompilerTime:
    pcVar3 = (char *)(this->m_strDefineScratch)._M_string_length;
    pcVar2 = "\"23:44:05\"";
    goto LAB_00144860;
  case NscMacro_Counter:
    snprintf(acStack_48,0x20,"%d",(ulong)(uint)this->m_nPreprocessorCounter);
    this->m_nPreprocessorCounter = this->m_nPreprocessorCounter + 1;
LAB_0014481a:
    pcVar3 = (char *)(this->m_strDefineScratch)._M_string_length;
    strlen(acStack_48);
    goto LAB_00144860;
  case NscMacro_Function:
    if (this->m_fPhase2 != false) {
      pNVar1 = this->m_pCurrentFence;
      while( true ) {
        if (pNVar1 == (NscSymbolFence *)0x0) {
          GenerateMessage(this,NscMessage_ErrorFuncNameMacroNotInFunction);
          std::__cxx11::string::operator=((string *)&this->m_strDefineScratch,"\"\"");
          return &this->m_strDefineScratch;
        }
        if (pNVar1->nFenceType == NscFenceType_Function) break;
        pNVar1 = pNVar1->pNext;
      }
      if ((this->m_sSymbols).m_pauchData != (uchar *)0x0) {
        psVar4 = &this->m_strDefineScratch;
        std::__cxx11::string::_M_replace
                  ((ulong)psVar4,0,(char *)(this->m_strDefineScratch)._M_string_length,0x17d80f);
        std::__cxx11::string::append((char *)psVar4);
        std::__cxx11::string::append((char *)psVar4);
        return psVar4;
      }
      __assert_fail("pSymbol != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                    ,0xa27,
                    "const std::string *CNscContext::GetDefineValue(const DefineEntry *, bool)");
    }
    pcVar3 = (char *)(this->m_strDefineScratch)._M_string_length;
    pcVar2 = "\"\"";
LAB_00144860:
    psVar4 = &this->m_strDefineScratch;
    std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar3,(ulong)pcVar2);
    break;
  default:
    if (GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::strEmpty_abi_cxx11_ == '\0'
       ) {
      GetDefineValue_abi_cxx11_();
    }
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                  ,0xa36,"const std::string *CNscContext::GetDefineValue(const DefineEntry *, bool)"
                 );
  }
  return psVar4;
}

Assistant:

const std::string *CNscContext::GetDefineValue (const DefineEntry *psDefine,
	bool fSimpleOnly)
{
	switch (psDefine ->nMacro)
	{

		//
		// If the define is simple replacement
		//

	case NscMacro_Simple:
		return &psDefine ->strValue;

		//
		// If the define is a function-like macro
		//

	case NscMacro_FunctionLike:
		if (fSimpleOnly)
		{
			GenerateMessage (NscMessage_ErrorFunctionLikeMacroNotAllowed);
			return &psDefine ->strValue;
		}

		GenerateMessage (NscMessage_ErrorFunctionLikeMacroNotImpl);
		return &psDefine ->strValue;

		//
		// If the define is __FILE__
		//

	case NscMacro_File:
		m_strDefineScratch = "\"";
		m_strDefineScratch += m_asFiles [GetCurrentFile ()] .strName;
		m_strDefineScratch += "\"";
		return &m_strDefineScratch;

		//
		// If the define is __LINE__
		//

	case NscMacro_Line:
		{
			char szLineNumber [32];

			snprintf (szLineNumber, sizeof (szLineNumber), "%d",
				GetCurrentLine ());

			m_strDefineScratch = szLineNumber;

			return &m_strDefineScratch;
		}
		break;

		//
		// If the define is __DATE__
		//

	case NscMacro_Date:
		return &m_strCompileDate;

		//
		// If the define is __TIME__
		//

	case NscMacro_Time:
		return &m_strCompileTime;

		//
		// If the define is __NSC_COMPILER_DATE__
		//

	case NscMacro_NscCompilerDate:
		m_strDefineScratch = "\"" __DATE__ "\"";
		return &m_strDefineScratch;

		//
		// If the define is __NSC_COMPILER_TIME__
		//

	case NscMacro_NscCompilerTime:
		m_strDefineScratch = "\"" __TIME__ "\"";
		return &m_strDefineScratch;

		//
		// If the define is __COUNTER__
		//

	case NscMacro_Counter:
		{
			char szCounter [32];

			snprintf (szCounter, sizeof (szCounter), "%d",
				m_nPreprocessorCounter);
			m_nPreprocessorCounter += 1;
			m_strDefineScratch = szCounter;
			return &m_strDefineScratch;
		}
		break;

		//
		// If the define is __FUNCTION__
		//

	case NscMacro_Function:
		{

			//
			// If we don't have to process this
			//

			if (!IsPhase2 ())
			{
				m_strDefineScratch = "\"\"";
				return &m_strDefineScratch;
			}

			//
			// Get the current function name
			//

			NscSymbolFence *pFunctionFence = GetCurrentFunctionFence ();
			NscSymbol *pSymbol;

			if (pFunctionFence == NULL)
			{
				GenerateMessage (NscMessage_ErrorFuncNameMacroNotInFunction);
				m_strDefineScratch = "\"\"";
				return &m_strDefineScratch;
			}

			pSymbol = GetSymbol (pFunctionFence ->nFnSymbol);
			assert (pSymbol != NULL);

			m_strDefineScratch = "\"";
			m_strDefineScratch += pSymbol ->szString;
			m_strDefineScratch += "\"";
			return &m_strDefineScratch;
		}
		break;

		//
		// Otherwise we have a missing case (Nsc.h out of sync)
		//

	default:
		static const std::string strEmpty;
		assert (false);
		return &strEmpty;

	}
}